

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O0

bool __thiscall FOptionMenuFieldBase::SetString(FOptionMenuFieldBase *this,int i,char *s)

{
  UCVarValue vval;
  char *s_local;
  int i_local;
  FOptionMenuFieldBase *this_local;
  
  if (i == 0) {
    if (this->mCVar != (FBaseCVar *)0x0) {
      FBaseCVar::SetGenericRep(this->mCVar,(UCVarValue)s,CVAR_String);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SetString ( int i, const char* s )
	{
		if ( i == 0 )
		{
			if ( mCVar )
			{
				UCVarValue vval;
				vval.String = s;
				mCVar->SetGenericRep( vval, CVAR_String );
			}

			return true;
		}

		return false;
	}